

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::ReclassifyNode(ImTriangulator *this,ImTriangulatorNode *n1)

{
  bool bVar1;
  ImTriangulatorNode *in_RSI;
  ImTriangulator *in_RDI;
  ImTriangulatorNode *n2;
  ImTriangulatorNode *n0;
  ImTriangulatorNodeType type;
  ImTriangulatorNode *v1;
  ImTriangulatorNode *v0;
  int in_stack_ffffffffffffffec;
  ImTriangulatorNodeType IVar2;
  ImTriangulator *this_00;
  
  v0 = in_RSI->Prev;
  v1 = in_RSI->Next;
  this_00 = in_RDI;
  bVar1 = ImTriangleIsClockwise(&v0->Pos,&in_RSI->Pos,&v1->Pos);
  if (bVar1) {
    bVar1 = IsEar(this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffec,
                  (ImVec2 *)v0,(ImVec2 *)v1,(ImVec2 *)n2);
    IVar2 = (ImTriangulatorNodeType)bVar1;
  }
  else {
    IVar2 = ImTriangulatorNodeType_Reflex;
  }
  if (IVar2 != in_RSI->Type) {
    if (in_RSI->Type == ImTriangulatorNodeType_Reflex) {
      ImTriangulatorNodeSpan::find_erase_unsorted(&in_RDI->_Reflexes,in_RSI->Index);
    }
    else if (in_RSI->Type == ImTriangulatorNodeType_Ear) {
      ImTriangulatorNodeSpan::find_erase_unsorted(&in_RDI->_Ears,in_RSI->Index);
    }
    if (IVar2 == ImTriangulatorNodeType_Reflex) {
      ImTriangulatorNodeSpan::push_back(&in_RDI->_Reflexes,in_RSI);
    }
    else if (IVar2 == ImTriangulatorNodeType_Ear) {
      ImTriangulatorNodeSpan::push_back(&in_RDI->_Ears,in_RSI);
    }
    in_RSI->Type = IVar2;
  }
  return;
}

Assistant:

void ImTriangulator::ReclassifyNode(ImTriangulatorNode* n1)
{
    // Classify node
    ImTriangulatorNodeType type;
    const ImTriangulatorNode* n0 = n1->Prev;
    const ImTriangulatorNode* n2 = n1->Next;
    if (!ImTriangleIsClockwise(n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Reflex;
    else if (IsEar(n0->Index, n1->Index, n2->Index, n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Ear;
    else
        type = ImTriangulatorNodeType_Convex;

    // Update lists when a type changes
    if (type == n1->Type)
        return;
    if (n1->Type == ImTriangulatorNodeType_Reflex)
        _Reflexes.find_erase_unsorted(n1->Index);
    else if (n1->Type == ImTriangulatorNodeType_Ear)
        _Ears.find_erase_unsorted(n1->Index);
    if (type == ImTriangulatorNodeType_Reflex)
        _Reflexes.push_back(n1);
    else if (type == ImTriangulatorNodeType_Ear)
        _Ears.push_back(n1);
    n1->Type = type;
}